

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall phosg::Image::save(Image *this,string *filename,Format format)

{
  code *local_50;
  FILE *local_48;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"wb","");
  fopen_unique((phosg *)&local_50,(string *)filename,&local_40,(FILE *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  save(this,local_48,format);
  if (local_48 != (FILE *)0x0) {
    (*local_50)();
  }
  return;
}

Assistant:

void Image::save(const string& filename, Format format) const {
  auto f = fopen_unique(filename, "wb");
  this->save(f.get(), format);
}